

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex.cpp
# Opt level: O0

void __thiscall Vertex::Vertex(Vertex *this,double x,double y,double z)

{
  undefined4 *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  Vec3d local_38;
  double local_20;
  double local_18;
  double local_10;
  
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  Vec3d::Vec3d((Vec3d *)(in_RDI + 2),0.0,0.0,0.0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x323b9f);
  *in_RDI = 0xffffff9f;
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x323bb4);
  Vec3d::Vec3d(&local_38,local_10,local_18,local_20);
  *(double *)(in_RDI + 2) = local_38.x;
  *(double *)(in_RDI + 4) = local_38.y;
  *(double *)(in_RDI + 6) = local_38.z;
  Vec3d::~Vec3d(&local_38);
  return;
}

Assistant:

Vertex::Vertex(double x,double y,double z)
{
	id = -97;
	neighborVertexIds.clear();
	pos = Vec3d(x,y,z);
}